

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O2

void anon_unknown.dwarf_27cbc4::fill2
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny,unsigned_short v
               )

{
  long lVar1;
  unsigned_short *puVar2;
  long lVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = 0;
  uVar7 = (ulong)(uint)nx;
  if (nx < 1) {
    uVar7 = uVar5;
  }
  uVar6 = (ulong)(uint)ny;
  if (ny < 1) {
    uVar6 = uVar5;
  }
  for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
    lVar1 = a->_sizeY;
    puVar2 = a->_data;
    lVar3 = b->_sizeY;
    puVar4 = b->_data;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *(unsigned_short *)((long)puVar4 + uVar8 * 2 + lVar3 * uVar5) = v;
      *(unsigned_short *)((long)puVar2 + uVar8 * 2 + lVar1 * uVar5) = v;
    }
    uVar5 = uVar5 + 2;
  }
  return;
}

Assistant:

void
fill2 (Array2D <unsigned short> &a,
       Array2D <unsigned short> &b,
       int nx,
       int ny,
       unsigned short v)
{
    for (int y = 0; y < ny; ++y)
	for (int x = 0; x < nx; ++x)
	    a[y][x] = b[y][x] = v;
}